

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O2

void TestDivideModuloIntBignum(void)

{
  bool bVar1;
  uint16_t uVar2;
  undefined1 uVar3;
  char *pcVar4;
  int in_R9D;
  undefined4 in_register_0000008c;
  Bignum third;
  Bignum other;
  Bignum bignum;
  char buffer [1024];
  
  bignum.used_bigits_ = 0;
  bignum.exponent_ = 0;
  other.used_bigits_ = 0;
  other.exponent_ = 0;
  third.used_bigits_ = 0;
  third.exponent_ = 0;
  double_conversion::Bignum::AssignUInt16(&bignum,10);
  double_conversion::Bignum::AssignUInt16(&other,2);
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&bignum,&other);
  pcVar4 = (char *)(ulong)uVar2;
  uVar3 = 199;
  CheckEqualsHelper((char *)0x3df,0xc1dc04,(char *)0x5,0xc0c2c7,pcVar4,in_R9D);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x3e0,0xc0801b,(char *)(ulong)bVar1,(bool)uVar3);
  CheckEqualsHelper((char *)0x3e1,0xc08043,"0",buffer,pcVar4,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  double_conversion::Bignum::AssignUInt16(&bignum,10);
  double_conversion::Bignum::ShiftLeft(&bignum,500);
  double_conversion::Bignum::AssignUInt16(&other,2);
  double_conversion::Bignum::ShiftLeft(&other,500);
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&bignum,&other);
  pcVar4 = (char *)(ulong)uVar2;
  uVar3 = 199;
  CheckEqualsHelper((char *)0x3e7,0xc1dc04,(char *)0x5,0xc0c2c7,pcVar4,in_R9D);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x3e8,0xc0801b,(char *)(ulong)bVar1,(bool)uVar3);
  CheckEqualsHelper((char *)0x3e9,0xc08043,"0",buffer,pcVar4,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  double_conversion::Bignum::AssignUInt16(&bignum,0xb);
  double_conversion::Bignum::AssignUInt16(&other,2);
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&bignum,&other);
  pcVar4 = (char *)(ulong)uVar2;
  uVar3 = 199;
  CheckEqualsHelper((char *)0x3ed,0xc1dc04,(char *)0x5,0xc0c2c7,pcVar4,in_R9D);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x3ee,0xc0801b,(char *)(ulong)bVar1,(bool)uVar3);
  CheckEqualsHelper((char *)0x3ef,0xc080d3,"1",buffer,pcVar4,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  double_conversion::Bignum::AssignUInt16(&bignum,10);
  double_conversion::Bignum::ShiftLeft(&bignum,500);
  double_conversion::Bignum::AssignUInt16(&other,1);
  double_conversion::Bignum::AddBignum(&bignum,&other);
  double_conversion::Bignum::AssignUInt16(&other,2);
  double_conversion::Bignum::ShiftLeft(&other,500);
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&bignum,&other);
  pcVar4 = (char *)(ulong)uVar2;
  uVar3 = 199;
  CheckEqualsHelper((char *)0x3f7,0xc1dc04,(char *)0x5,0xc0c2c7,pcVar4,in_R9D);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x3f8,0xc0801b,(char *)(ulong)bVar1,(bool)uVar3);
  CheckEqualsHelper((char *)0x3f9,0xc080d3,"1",buffer,pcVar4,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  double_conversion::Bignum::AssignUInt16(&bignum,10);
  double_conversion::Bignum::ShiftLeft(&bignum,500);
  double_conversion::Bignum::AssignBignum(&other,&bignum);
  double_conversion::Bignum::MultiplyByUInt32(&bignum,0x1234);
  double_conversion::Bignum::AssignUInt16(&third,0xfff);
  double_conversion::Bignum::AddBignum(&bignum,&third);
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&bignum,&other);
  pcVar4 = (char *)(ulong)uVar2;
  uVar3 = 199;
  CheckEqualsHelper((char *)0x401,0xc0c2eb,(char *)0x1234,0xc0c2c7,pcVar4,in_R9D);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x402,0xc0801b,(char *)(ulong)bVar1,(bool)uVar3);
  CheckEqualsHelper((char *)0x403,0xc0c2f2,"FFF",buffer,pcVar4,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  double_conversion::Bignum::AssignUInt16(&bignum,10);
  AssignHexString(&other,"1234567890");
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&bignum,&other);
  pcVar4 = (char *)(ulong)uVar2;
  uVar3 = 199;
  CheckEqualsHelper((char *)0x407,0xc166fe,(char *)0x0,0xc0c2c7,pcVar4,in_R9D);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x408,0xc0801b,(char *)(ulong)bVar1,(bool)uVar3);
  CheckEqualsHelper((char *)0x409,0xc0804e,"A",buffer,pcVar4,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  AssignHexString(&bignum,"12345678");
  AssignHexString(&other,"3789012");
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&bignum,&other);
  pcVar4 = (char *)(ulong)uVar2;
  uVar3 = 199;
  CheckEqualsHelper((char *)0x40d,0xc1dc04,(char *)0x5,0xc0c2c7,pcVar4,in_R9D);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x40e,0xc0801b,(char *)(ulong)bVar1,(bool)uVar3);
  CheckEqualsHelper((char *)0x40f,0xc0c300,"D9861E",buffer,pcVar4,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  AssignHexString(&bignum,"70000001");
  AssignHexString(&other,"1FFFFFFF");
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&bignum,&other);
  pcVar4 = (char *)(ulong)uVar2;
  uVar3 = 199;
  CheckEqualsHelper((char *)0x413,0xc13999,(char *)0x3,0xc0c2c7,pcVar4,in_R9D);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x414,0xc0801b,(char *)(ulong)bVar1,(bool)uVar3);
  CheckEqualsHelper((char *)0x415,0xc0c322,"10000004",buffer,pcVar4,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  AssignHexString(&bignum,"28000000");
  AssignHexString(&other,"12A05F20");
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&bignum,&other);
  pcVar4 = (char *)(ulong)uVar2;
  uVar3 = 199;
  CheckEqualsHelper((char *)0x419,0xc172d3,(char *)0x2,0xc0c2c7,pcVar4,in_R9D);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x41a,0xc0801b,(char *)(ulong)bVar1,(bool)uVar3);
  CheckEqualsHelper((char *)0x41b,0xc0c348,"2BF41C0",buffer,pcVar4,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  double_conversion::Bignum::AssignUInt16(&bignum,10);
  double_conversion::Bignum::ShiftLeft(&bignum,500);
  double_conversion::Bignum::AssignBignum(&other,&bignum);
  double_conversion::Bignum::MultiplyByUInt32(&bignum,0x1234);
  double_conversion::Bignum::AssignUInt16(&third,0xfff);
  double_conversion::Bignum::SubtractBignum(&other,&third);
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&bignum,&other);
  pcVar4 = (char *)(ulong)uVar2;
  uVar3 = 199;
  CheckEqualsHelper((char *)0x423,0xc0c2eb,(char *)0x1234,0xc0c2c7,pcVar4,in_R9D);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x424,0xc0801b,(char *)(ulong)bVar1,(bool)uVar3);
  CheckEqualsHelper((char *)0x425,0xc0c35a,"1232DCC",buffer,pcVar4,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  uVar2 = double_conversion::Bignum::DivideModuloIntBignum(&bignum,&other);
  pcVar4 = (char *)(ulong)uVar2;
  uVar3 = 199;
  CheckEqualsHelper((char *)0x426,0xc166fe,(char *)0x0,0xc0c2c7,pcVar4,in_R9D);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x427,0xc0801b,(char *)(ulong)bVar1,(bool)uVar3);
  CheckEqualsHelper((char *)0x428,0xc0c35a,"1232DCC",buffer,pcVar4,
                    (char *)CONCAT44(in_register_0000008c,in_R9D));
  return;
}

Assistant:

TEST(DivideModuloIntBignum) {
  char buffer[kBufferSize];
  Bignum bignum;
  Bignum other;
  Bignum third;

  bignum.AssignUInt16(10);
  other.AssignUInt16(2);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignUInt16(2);
  other.ShiftLeft(500);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  bignum.AssignUInt16(11);
  other.AssignUInt16(2);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignUInt16(1);
  bignum.AddBignum(other);
  other.AssignUInt16(2);
  other.ShiftLeft(500);
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignBignum(bignum);
  bignum.MultiplyByUInt32(0x1234);
  third.AssignUInt16(0xFFF);
  bignum.AddBignum(third);
  CHECK_EQ(0x1234, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFF", buffer);

  bignum.AssignUInt16(10);
  AssignHexString(&other, "1234567890");
  CHECK_EQ(0, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);

  AssignHexString(&bignum, "12345678");
  AssignHexString(&other, "3789012");
  CHECK_EQ(5, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("D9861E", buffer);

  AssignHexString(&bignum, "70000001");
  AssignHexString(&other, "1FFFFFFF");
  CHECK_EQ(3, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000004", buffer);

  AssignHexString(&bignum, "28000000");
  AssignHexString(&other, "12A05F20");
  CHECK_EQ(2, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2BF41C0", buffer);

  bignum.AssignUInt16(10);
  bignum.ShiftLeft(500);
  other.AssignBignum(bignum);
  bignum.MultiplyByUInt32(0x1234);
  third.AssignUInt16(0xFFF);
  other.SubtractBignum(third);
  CHECK_EQ(0x1234, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1232DCC", buffer);
  CHECK_EQ(0, bignum.DivideModuloIntBignum(other));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1232DCC", buffer);
}